

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O0

bool __thiscall
cmAddCustomTargetCommand::InitialPass
          (cmAddCustomTargetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  size_type sVar4;
  const_reference pvVar5;
  long lVar6;
  ostream *poVar7;
  char *pcVar8;
  ulong uVar9;
  cmTarget *this_00;
  PolicyID id;
  byte local_7ea;
  cmTarget *target;
  undefined1 local_760 [6];
  bool escapeOldStyle;
  allocator local_739;
  string local_738;
  string local_718;
  char *local_6f8;
  char *build_dir;
  string msg_1;
  string local_6b0;
  byte local_689;
  undefined1 local_688 [7];
  bool issueMessage;
  ostringstream e_1;
  MessageType local_510;
  bool local_509;
  MessageType messageType;
  bool nameOk;
  undefined1 local_4e8 [8];
  ostringstream msg;
  size_type pos;
  string local_360;
  undefined1 local_340 [8];
  string dep;
  string filename;
  string *copy;
  uint j;
  uint start;
  undefined1 local_2e8 [3];
  bool excludeFromAll;
  tdoing doing;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  char *comment;
  string comment_buffer;
  undefined1 local_2a0 [6];
  bool uses_terminal;
  bool verbatim;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  cmCustomCommandLine currentLine;
  string local_218;
  undefined1 local_1f8 [8];
  ostringstream e;
  undefined1 local_80 [8];
  string targetName;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddCustomTargetCommand *this_local;
  
  local_28 = param_2;
  param_3_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_006ef4bb;
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_3_local,0);
  std::__cxx11::string::string((string *)local_80,(string *)pvVar5);
  lVar6 = std::__cxx11::string::find_first_of(local_80,0xa917a9);
  if (lVar6 == -1) {
    cmCustomCommandLine::cmCustomCommandLine
              ((cmCustomCommandLine *)
               &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                .super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    cmCustomCommandLines::cmCustomCommandLines
              ((cmCustomCommandLines *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&byproducts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&working_directory.field_2 + 8));
    std::__cxx11::string::string((string *)local_2a0);
    comment_buffer.field_2._M_local_buf[0xf] = '\0';
    comment_buffer.field_2._M_local_buf[0xe] = '\0';
    std::__cxx11::string::string((string *)&comment);
    sources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2e8);
    start = 0;
    j._3_1_ = true;
    copy._4_4_ = 1;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_3_local);
    if (1 < sVar4) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_3_local,1);
      bVar2 = std::operator==(pvVar5,"ALL");
      if (bVar2) {
        copy._4_4_ = 2;
      }
      j._3_1_ = !bVar2;
    }
    for (copy._0_4_ = copy._4_4_;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_3_local), (uint)copy < sVar4; copy._0_4_ = (uint)copy + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_3_local,(ulong)(uint)copy);
      bVar2 = std::operator==(pvVar5,"DEPENDS");
      if (bVar2) {
        start = 1;
      }
      else {
        bVar2 = std::operator==(pvVar5,"BYPRODUCTS");
        if (bVar2) {
          start = 2;
        }
        else {
          bVar2 = std::operator==(pvVar5,"WORKING_DIRECTORY");
          if (bVar2) {
            start = 3;
          }
          else {
            bVar2 = std::operator==(pvVar5,"VERBATIM");
            if (bVar2) {
              start = 6;
              comment_buffer.field_2._M_local_buf[0xf] = '\x01';
            }
            else {
              bVar2 = std::operator==(pvVar5,"USES_TERMINAL");
              if (bVar2) {
                start = 6;
                comment_buffer.field_2._M_local_buf[0xe] = '\x01';
              }
              else {
                bVar2 = std::operator==(pvVar5,"COMMENT");
                if (bVar2) {
                  start = 4;
                }
                else {
                  bVar2 = std::operator==(pvVar5,"COMMAND");
                  if (bVar2) {
                    start = 0;
                    bVar2 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&commandLines.
                                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        .
                                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if (!bVar2) {
                      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                      push_back((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *
                                )&depends.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (value_type *)
                                &commandLines.
                                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                 .
                                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&commandLines.
                                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  .
                                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    }
                  }
                  else {
                    bVar2 = std::operator==(pvVar5,"SOURCES");
                    if (bVar2) {
                      start = 5;
                    }
                    else {
                      switch(start) {
                      case 0:
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&commandLines.
                                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        .
                                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar5);
                        break;
                      case 1:
                        std::__cxx11::string::string((string *)local_340,(string *)pvVar5);
                        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_340);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&byproducts.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (value_type *)local_340);
                        std::__cxx11::string::~string((string *)local_340);
                        break;
                      case 2:
                        std::__cxx11::string::string((string *)(dep.field_2._M_local_buf + 8));
                        pcVar8 = (char *)std::__cxx11::string::c_str();
                        bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar8);
                        if (!bVar2) {
                          pcVar8 = cmMakefile::GetCurrentBinaryDirectory
                                             ((this->super_cmCommand).Makefile);
                          std::__cxx11::string::operator=
                                    ((string *)(dep.field_2._M_local_buf + 8),pcVar8);
                          std::__cxx11::string::operator+=
                                    ((string *)(dep.field_2._M_local_buf + 8),"/");
                        }
                        std::__cxx11::string::operator+=
                                  ((string *)(dep.field_2._M_local_buf + 8),(string *)pvVar5);
                        cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&dep.field_2 + 8))
                        ;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)((long)&working_directory.field_2 + 8),
                                    (value_type *)((long)&dep.field_2 + 8));
                        std::__cxx11::string::~string((string *)(dep.field_2._M_local_buf + 8));
                        break;
                      case 3:
                        std::__cxx11::string::operator=((string *)local_2a0,(string *)pvVar5);
                        break;
                      case 4:
                        std::__cxx11::string::operator=((string *)&comment,(string *)pvVar5);
                        sources.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)std::__cxx11::string::c_str();
                        break;
                      case 5:
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_2e8,pvVar5);
                        break;
                      default:
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_360,"Wrong syntax. Unknown type of argument.",
                                   (allocator *)((long)&pos + 7));
                        cmCommand::SetError(&this->super_cmCommand,&local_360);
                        std::__cxx11::string::~string((string *)&local_360);
                        std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
                        this_local._7_1_ = 0;
                        goto LAB_006ef3f9;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    lVar6 = std::__cxx11::string::find_first_of(local_80,0xa8d025);
    if (lVar6 == -1) {
      bVar2 = cmGeneratorExpression::IsValidTargetName((string *)local_80);
      local_7ea = 0;
      if (bVar2) {
        bVar2 = cmGlobalGenerator::IsReservedTarget((string *)local_80);
        local_7ea = bVar2 ^ 0xff;
      }
      local_509 = (bool)(local_7ea & 1);
      if (local_509 != false) {
        lVar6 = std::__cxx11::string::find(local_80,0xa71ba0);
        local_509 = lVar6 == -1;
      }
      if (local_509 == false) {
        local_510 = AUTHOR_WARNING;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_688);
        local_689 = 0;
        PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
        if (PVar3 != OLD) {
          if (PVar3 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_6b0,(cmPolicies *)0x25,id);
            poVar7 = std::operator<<((ostream *)local_688,(string *)&local_6b0);
            std::operator<<(poVar7,"\n");
            std::__cxx11::string::~string((string *)&local_6b0);
            local_689 = 1;
          }
          else if (PVar3 - NEW < 3) {
            local_689 = 1;
            local_510 = FATAL_ERROR;
          }
        }
        if ((local_689 & 1) == 0) {
LAB_006eefd0:
          bVar2 = false;
        }
        else {
          poVar7 = std::operator<<((ostream *)local_688,"The target name \"");
          poVar7 = std::operator<<(poVar7,(string *)local_80);
          std::operator<<(poVar7,
                          "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                         );
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,local_510,(string *)((long)&msg_1.field_2 + 8),false);
          std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
          if (local_510 != FATAL_ERROR) goto LAB_006eefd0;
          this_local._7_1_ = 0;
          bVar2 = true;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_688);
        if (bVar2) goto LAB_006ef3f9;
      }
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&commandLines.
                          super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar2) {
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   &depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type *)
                   &commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::__cxx11::string::string((string *)&build_dir);
      bVar2 = cmMakefile::EnforceUniqueName
                        ((this->super_cmCommand).Makefile,(string *)local_80,(string *)&build_dir,
                         true);
      if (!bVar2) {
        cmCommand::SetError(&this->super_cmCommand,(string *)&build_dir);
        this_local._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)&build_dir);
      if (bVar2) {
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          local_6f8 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          cmsys::SystemTools::CollapseFullPath(&local_718,(string *)local_2a0,local_6f8);
          std::__cxx11::string::operator=((string *)local_2a0,(string *)&local_718);
          std::__cxx11::string::~string((string *)&local_718);
        }
        bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                          ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                           &depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((!bVar2) ||
           (bVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&working_directory.field_2 + 8)), bVar2)) {
          bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                             &depends.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((bVar2) && ((comment_buffer.field_2._M_local_buf[0xe] & 1U) != 0)) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_760,"USES_TERMINAL may not be specified without any COMMAND",
                       (allocator *)((long)&target + 7));
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_760,false);
            std::__cxx11::string::~string((string *)local_760);
            std::allocator<char>::~allocator((allocator<char> *)((long)&target + 7));
            this_local._7_1_ = 1;
          }
          else {
            target._6_1_ = ~comment_buffer.field_2._M_local_buf[0xf] & 1;
            pcVar1 = (this->super_cmCommand).Makefile;
            pcVar8 = (char *)std::__cxx11::string::c_str();
            this_00 = cmMakefile::AddUtilityCommand
                                (pcVar1,(string *)local_80,j._3_1_,pcVar8,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)((long)&working_directory.field_2 + 8),
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&byproducts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (cmCustomCommandLines *)
                                 &depends.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (bool)(target._6_1_ & 1),
                                 (char *)sources.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (bool)(comment_buffer.field_2._M_local_buf[0xe] & 1));
            cmTarget::AddSources
                      (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2e8);
            this_local._7_1_ = 1;
          }
        }
        else {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_738,"BYPRODUCTS may not be specified without any COMMAND",
                     &local_739);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_738,false);
          std::__cxx11::string::~string((string *)&local_738);
          std::allocator<char>::~allocator((allocator<char> *)&local_739);
          this_local._7_1_ = 1;
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
      poVar7 = std::operator<<((ostream *)local_4e8,"called with target name containing a \"");
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
      poVar7 = std::operator<<(poVar7,*pcVar8);
      std::operator<<(poVar7,"\".  This character is not allowed.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&messageType);
      std::__cxx11::string::~string((string *)&messageType);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
    }
LAB_006ef3f9:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2e8);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)local_2a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&working_directory.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&byproducts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmCustomCommandLines::~cmCustomCommandLines
              ((cmCustomCommandLines *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmCustomCommandLine::~cmCustomCommandLine
              ((cmCustomCommandLine *)
               &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                .super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar7 = std::operator<<((ostream *)local_1f8,"called with invalid target name \"");
    poVar7 = std::operator<<(poVar7,(string *)local_80);
    poVar7 = std::operator<<(poVar7,"\".  Target names may not contain a slash.  ");
    std::operator<<(poVar7,"Use ADD_CUSTOM_COMMAND to generate files.");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  }
  std::__cxx11::string::~string((string *)local_80);
LAB_006ef4bb:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddCustomTargetCommand
::InitialPass(std::vector<std::string> const& args,
              cmExecutionStatus&)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string targetName = args[0];

  // Check the target name.
  if(targetName.find_first_of("/\\") != targetName.npos)
    {
    std::ostringstream e;
    e << "called with invalid target name \"" << targetName
      << "\".  Target names may not contain a slash.  "
      << "Use ADD_CUSTOM_COMMAND to generate files.";
    this->SetError(e.str());
    return false;
    }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends, byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  std::string comment_buffer;
  const char* comment = 0;
  std::vector<std::string> sources;

  // Keep track of parser state.
  enum tdoing {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if(args.size() > 1)
    {
    if(args[1] == "ALL")
      {
      excludeFromAll = false;
      start = 2;
      }
    }

  // Parse the rest of the arguments.
  for(unsigned int j = start; j < args.size(); ++j)
    {
    std::string const& copy = args[j];

    if(copy == "DEPENDS")
      {
      doing = doing_depends;
      }
    else if(copy == "BYPRODUCTS")
      {
      doing = doing_byproducts;
      }
    else if(copy == "WORKING_DIRECTORY")
      {
      doing = doing_working_directory;
      }
    else if(copy == "VERBATIM")
      {
      doing = doing_nothing;
      verbatim = true;
      }
    else if(copy == "USES_TERMINAL")
      {
      doing = doing_nothing;
      uses_terminal = true;
      }
    else if (copy == "COMMENT")
      {
      doing = doing_comment;
      }
    else if(copy == "COMMAND")
      {
      doing = doing_command;

      // Save the current command before starting the next command.
      if(!currentLine.empty())
        {
        commandLines.push_back(currentLine);
        currentLine.clear();
        }
      }
    else if(copy == "SOURCES")
      {
      doing = doing_source;
      }
    else
      {
      switch (doing)
        {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts:
          {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy.c_str()))
            {
            filename = this->Makefile->GetCurrentBinaryDirectory();
            filename += "/";
            }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          byproducts.push_back(filename);
          }
          break;
        case doing_depends:
          {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(dep);
          }
          break;
         case doing_comment:
           comment_buffer = copy;
           comment = comment_buffer.c_str();
           break;
        case doing_source:
          sources.push_back(copy);
          break;
        default:
          this->SetError("Wrong syntax. Unknown type of argument.");
          return false;
        }
      }
    }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if(pos != targetName.npos)
    {
    std::ostringstream msg;
    msg << "called with target name containing a \"" << targetName[pos]
        << "\".  This character is not allowed.";
    this->SetError(msg.str());
    return false;
    }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk)
    {
    nameOk = targetName.find(":") == std::string::npos;
    }
  if (!nameOk)
    {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0037))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if (issueMessage)
      {
      e << "The target name \"" << targetName <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  // Store the last command line finished.
  if(!currentLine.empty())
    {
    commandLines.push_back(currentLine);
    currentLine.clear();
    }

  // Enforce name uniqueness.
  {
  std::string msg;
  if(!this->Makefile->EnforceUniqueName(targetName, msg, true))
    {
    this->SetError(msg);
    return false;
    }
  }

  // Convert working directory to a full path.
  if(!working_directory.empty())
    {
    const char* build_dir = this->Makefile->GetCurrentBinaryDirectory();
    working_directory =
      cmSystemTools::CollapseFullPath(working_directory, build_dir);
    }

  if (commandLines.empty() && !byproducts.empty())
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
      "BYPRODUCTS may not be specified without any COMMAND");
    return true;
    }
  if (commandLines.empty() && uses_terminal)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
      "USES_TERMINAL may not be specified without any COMMAND");
    return true;
    }

  // Add the utility target to the makefile.
  bool escapeOldStyle = !verbatim;
  cmTarget* target =
    this->Makefile->AddUtilityCommand(targetName, excludeFromAll,
                                      working_directory.c_str(),
                                      byproducts, depends,
                                      commandLines, escapeOldStyle, comment,
                                      uses_terminal);

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}